

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

Query * q_or(Query *__return_storage_ptr__,vector<Query,_std::allocator<Query>_> *queries)

{
  QueryType local_c;
  
  local_c = OR;
  Query::Query(__return_storage_ptr__,&local_c,queries);
  return __return_storage_ptr__;
}

Assistant:

Query q_or(std::vector<Query> &&queries) {
    return Query(QueryType::OR, std::move(queries));
}